

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QAbstractButton_*>::resize_impl
          (QVLABase<QAbstractButton_*> *this,qsizetype prealloc,void *array,qsizetype sz,
          QAbstractButton **v)

{
  bool bVar1;
  iterator prealloc_00;
  iterator ppQVar2;
  size_type sVar3;
  QAbstractButton **ppQVar4;
  long in_RCX;
  qsizetype in_RDX;
  QVLABase<QAbstractButton_*> *in_RSI;
  QVLABaseBase *in_RDI;
  QAbstractButton **in_R8;
  long in_FS_OFFSET;
  QVLABase<QAbstractButton_*> *in_stack_ffffffffffffff80;
  QVLABase<QAbstractButton_*> *in_stack_ffffffffffffffb8;
  QAbstractButton **args;
  QVLABaseBase *asize;
  size_type local_20;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = in_R8;
  asize = in_RDI;
  local_10 = in_RCX;
  prealloc_00 = begin((QVLABase<QAbstractButton_*> *)0x67743e);
  ppQVar2 = end(in_stack_ffffffffffffff80);
  bVar1 = QtPrivate::q_points_into_range<QAbstractButton*,std::less<void>>
                    (in_R8,prealloc_00,ppQVar2);
  if (bVar1) {
    resize_impl(in_RSI,in_RDX,args,(qsizetype)*args,(QAbstractButton **)in_stack_ffffffffffffffb8);
  }
  else {
    local_20 = QVLABaseBase::capacity(in_RDI);
    qMax<long_long>(&local_10,&local_20);
    reallocate_impl(in_stack_ffffffffffffffb8,(qsizetype)prealloc_00,in_R8,(qsizetype)asize,
                    (qsizetype)in_RSI);
    while( true ) {
      sVar3 = QVLABaseBase::size(in_RDI);
      if (local_10 <= sVar3) break;
      ppQVar4 = data((QVLABase<QAbstractButton_*> *)in_RDI);
      sVar3 = QVLABaseBase::size(in_RDI);
      q20::construct_at<QAbstractButton*,QAbstractButton*const&,void>(ppQVar4 + sVar3,args);
      in_RDI->s = in_RDI->s + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz, const T &v)
    {
        if (QtPrivate::q_points_into_range(&v, begin(), end())) {
            resize_impl(prealloc, array, sz, T(v));
            return;
        }
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        while (size() < sz) {
            q20::construct_at(data() + size(), v);
            ++s;
        }
    }